

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O1

void __thiscall Centaurus::ATNNode<char>::ATNNode(ATNNode<char> *this,ATNNode<char> *old)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_001c8e68;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (old->m_transitions).
       super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (old->m_transitions).
       super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (old->m_transitions).
       super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_type = old->m_type;
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_001c8d10;
  std::__cxx11::wstring::wstring((wstring *)&(this->m_invoke).m_id,(wstring *)&(old->m_invoke).m_id)
  ;
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001c8920;
  std::
  vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>::
  vector(&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states,
         &(old->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states);
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001c88c8;
  paVar1 = &(this->m_literal).field_2;
  (this->m_literal)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (old->m_literal)._M_dataplus._M_p;
  paVar4 = &(old->m_literal).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(old->m_literal).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_literal).field_2 + 8) = uVar3;
  }
  else {
    (this->m_literal)._M_dataplus._M_p = pcVar2;
    (this->m_literal).field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->m_literal)._M_string_length = (old->m_literal)._M_string_length;
  (old->m_literal)._M_dataplus._M_p = (pointer)paVar4;
  (old->m_literal)._M_string_length = 0;
  (old->m_literal).field_2._M_local_buf[0] = '\0';
  this->m_localid = old->m_localid;
  return;
}

Assistant:

ATNNode(ATNNode<TCHAR>&& old)
        : m_transitions(std::move(old.m_transitions)), m_type(old.m_type), m_invoke(std::move(old.m_invoke)), m_nfa(std::move(old.m_nfa)), m_literal(std::move(old.m_literal)), m_localid(old.m_localid)
    {
    }